

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

NewArrayExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::NewArrayExpression,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression_const*&,slang::SourceRange>
          (BumpAllocator *this,Type *args,Expression *args_1,Expression **args_2,SourceRange *args_3
          )

{
  Expression *pEVar1;
  SourceLocation SVar2;
  SourceLocation SVar3;
  NewArrayExpression *pNVar4;
  
  pNVar4 = (NewArrayExpression *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((NewArrayExpression *)this->endPtr < pNVar4 + 1) {
    pNVar4 = (NewArrayExpression *)allocateSlow(this,0x40,8);
  }
  else {
    this->head->current = (byte *)(pNVar4 + 1);
  }
  pEVar1 = *args_2;
  SVar2 = args_3->startLoc;
  SVar3 = args_3->endLoc;
  (pNVar4->super_Expression).kind = NewArray;
  (pNVar4->super_Expression).type.ptr = args;
  (pNVar4->super_Expression).constant = (ConstantValue *)0x0;
  (pNVar4->super_Expression).syntax = (ExpressionSyntax *)0x0;
  (pNVar4->super_Expression).sourceRange.startLoc = SVar2;
  (pNVar4->super_Expression).sourceRange.endLoc = SVar3;
  pNVar4->sizeExpr_ = args_1;
  pNVar4->initializer_ = pEVar1;
  return pNVar4;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }